

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stats.cc
# Opt level: O3

void WriteCountsWithImmediates(Stream *stream,OpcodeInfoCounts *counts)

{
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  type *info;
  pair<wabt::OpcodeInfo,_unsigned_long> *this;
  vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  sorted;
  _TmpBuf __buf;
  vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  local_58;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<wabt::OpcodeInfo,_unsigned_long>_*,_std::vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>_>,_std::pair<wabt::OpcodeInfo,_unsigned_long>_>
  local_38;
  
  local_58.
  super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pair<wabt::OpcodeInfo,_unsigned_long> *)0x0;
  local_58.
  super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pair<wabt::OpcodeInfo,_unsigned_long> *)0x0;
  local_58.
  super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  copy_if<std::_Rb_tree_const_iterator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>,std::back_insert_iterator<std::vector<std::pair<wabt::OpcodeInfo,unsigned_long>,std::allocator<std::pair<wabt::OpcodeInfo,unsigned_long>>>>,WithinCutoff<std::pair<wabt::OpcodeInfo,unsigned_long>>>
            ((counts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             &(counts->_M_t)._M_impl.super__Rb_tree_header,&local_58);
  ppVar2 = local_58.
           super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar1 = local_58.
           super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_58.
      super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar3 = ((long)local_58.
                   super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_58.
                   super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<wabt::OpcodeInfo,_unsigned_long>_*,_std::vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>_>,_std::pair<wabt::OpcodeInfo,_unsigned_long>_>
    ::_Temporary_buffer(&local_38,
                        (__normal_iterator<std::pair<wabt::OpcodeInfo,_unsigned_long>_*,_std::vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>_>
                         )local_58.
                          super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                        (lVar3 - (lVar3 + 1 >> 0x3f)) + 1 >> 1);
    if (local_38._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<wabt::OpcodeInfo,unsigned_long>*,std::vector<std::pair<wabt::OpcodeInfo,unsigned_long>,std::allocator<std::pair<wabt::OpcodeInfo,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<SortByCountDescending<std::pair<wabt::OpcodeInfo,unsigned_long>>>>
                (ppVar1,ppVar2);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<wabt::OpcodeInfo,unsigned_long>*,std::vector<std::pair<wabt::OpcodeInfo,unsigned_long>,std::allocator<std::pair<wabt::OpcodeInfo,unsigned_long>>>>,std::pair<wabt::OpcodeInfo,unsigned_long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<SortByCountDescending<std::pair<wabt::OpcodeInfo,unsigned_long>>>>
                (ppVar1,ppVar2,local_38._M_buffer,local_38._M_len);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<wabt::OpcodeInfo,_unsigned_long>_*,_std::vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>_>,_std::pair<wabt::OpcodeInfo,_unsigned_long>_>
    ::~_Temporary_buffer(&local_38);
    ppVar1 = local_58.
             super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this = local_58.
                super__Vector_base<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this != ppVar1; this = this + 1) {
      wabt::OpcodeInfo::Write(&this->first,stream);
      wabt::Stream::Writef(stream,"%s%zd\n",s_separator,this->second);
    }
  }
  std::
  vector<std::pair<wabt::OpcodeInfo,_unsigned_long>,_std::allocator<std::pair<wabt::OpcodeInfo,_unsigned_long>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void WriteCountsWithImmediates(Stream& stream, const OpcodeInfoCounts& counts) {
  // Remove const from the key type so we can sort below.
  using OpcodeInfoCountPair =
      std::pair<std::remove_const<OpcodeInfoCounts::key_type>::type,
                OpcodeInfoCounts::mapped_type>;

  std::vector<OpcodeInfoCountPair> sorted;
  std::copy_if(counts.begin(), counts.end(), std::back_inserter(sorted),
               WithinCutoff<OpcodeInfoCountPair>());

  // Use a stable sort to keep the elements with the same count in opcode info
  // order (since the OpcodeInfoCounts map is sorted).
  std::stable_sort(sorted.begin(), sorted.end(),
                   SortByCountDescending<OpcodeInfoCountPair>());

  for (auto& [info, count] : sorted) {
    info.Write(stream);
    stream.Writef("%s%" PRIzd "\n", s_separator, count);
  }
}